

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>,Eigen::internal::add_assign_op<double,double>>
               (Matrix<double,_3,_1,_0,_3,_1> *dst,Matrix<double,_3,_1,_0,_3,_1> *src,
               add_assign_op<double,_double> *func)

{
  SrcEvaluatorType func_00;
  Matrix<double,_3,_1,_0,_3,_1> *dstExpr;
  undefined1 local_60 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_28;
  SrcEvaluatorType srcEvaluator;
  add_assign_op<double,_double> *func_local;
  Matrix<double,_3,_1,_0,_3,_1> *src_local;
  Matrix<double,_3,_1,_0,_3,_1> *dst_local;
  
  srcEvaluator.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.
  data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>)func;
  evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::evaluator(&local_28,src);
  resize_if_allowed<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>,Eigen::internal::add_assign_op<double,double>>
            (dst,src,(add_assign_op<double,_double> *)
                     srcEvaluator.
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     .m_d.data);
  evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::evaluator
            ((evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator;
  dstExpr = EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::const_cast_derived
                      ((EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
              *)local_60,(DstEvaluatorType *)&kernel.m_dstExpr,&local_28,
             (add_assign_op<double,_double> *)
             func_00.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             .m_d.data,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_3,_2>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
         *)local_60);
  evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~evaluator
            ((evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&kernel.m_dstExpr);
  evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~evaluator(&local_28);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}